

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_refs.c
# Opt level: O1

uint64_t protect_next(refs_table_t *tbl,uint64_t **_bucket,size_t end)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t *puVar3;
  
  uVar2 = **_bucket;
  puVar3 = *_bucket + 1;
  if (puVar3 != tbl->refs_table + end) {
    do {
      uVar1 = *puVar3;
      if ((uVar1 == 0) || (uVar1 == 0x7fffffffffffffff)) {
        puVar3 = puVar3 + 1;
      }
      else {
        *_bucket = puVar3;
      }
      if ((uVar1 != 0x7fffffffffffffff) && (uVar1 != 0)) {
        return uVar2;
      }
    } while (puVar3 != tbl->refs_table + end);
  }
  *_bucket = (uint64_t *)0x0;
  return uVar2;
}

Assistant:

uint64_t
protect_next(refs_table_t *tbl, uint64_t **_bucket, size_t end)
{
    _Atomic(uint64_t)* bucket = (_Atomic(uint64_t)*) *_bucket;
    // assert(bucket != NULL);
    // assert(end <= tbl->refs_size);
    uint64_t result = *bucket;
    bucket++;
    while (bucket != tbl->refs_table + end) {
        uint64_t d = atomic_load_explicit(bucket, memory_order_relaxed);
        if (d != 0 && d != refs_ts) {
            *_bucket = (uint64_t*)bucket;
            return result;
        }
        bucket++;
    }
    *_bucket = NULL;
    return result;
}